

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O0

void anon_unknown.dwarf_7d438::append_rewrite_rule(RewriteRules *r,char *str)

{
  ostream *poVar1;
  RewritePattern *in_RSI;
  vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *in_RDI;
  string tmp;
  size_t n;
  char *col [3];
  ostream *in_stack_ffffffffffffff68;
  ostream *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  char **in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  string local_68 [54];
  byte local_32;
  die local_31;
  size_t local_30;
  char *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  local_30 = MeCab::tokenize2<char**>
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                        in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_32 = 0;
  if (local_30 < 2) {
    MeCab::die::die(&local_31);
    local_32 = 1;
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar1 = std::operator<<(poVar1,"(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x19);
    poVar1 = std::operator<<(poVar1,") [");
    in_stack_ffffffffffffff70 = std::operator<<(poVar1,"n >= 2");
    in_stack_ffffffffffffff68 = std::operator<<(in_stack_ffffffffffffff70,"] ");
    poVar1 = std::operator<<(in_stack_ffffffffffffff68,"format error: ");
    poVar1 = std::operator<<(poVar1,(char *)in_RSI);
    MeCab::die::operator&(&local_31,poVar1);
  }
  if ((local_32 & 1) != 0) {
    MeCab::die::~die((die *)0x1e347c);
  }
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::size(in_RDI);
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::resize
            ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)
             in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
  std::__cxx11::string::string(local_68);
  if (2 < local_30) {
    std::__cxx11::string::operator=(local_68,in_stack_ffffffffffffffe0);
    std::__cxx11::string::operator+=(local_68,' ');
    std::__cxx11::string::operator+=(local_68,in_stack_ffffffffffffffe8);
    in_stack_ffffffffffffffe0 = (char *)std::__cxx11::string::c_str();
  }
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::back(in_RDI);
  MeCab::RewritePattern::set_pattern(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void append_rewrite_rule(RewriteRules *r, char* str) {
  char *col[3];
  const size_t n = tokenize2(str, " \t", col, 3);
  CHECK_DIE(n >= 2) << "format error: " << str;
  r->resize(r->size() + 1);
  std::string tmp;
  if (n >= 3) {
    tmp = col[1];
    tmp += ' ';
    tmp += col[2];
    col[1] = const_cast<char *>(tmp.c_str());
  }
  r->back().set_pattern(col[0], col[1]);
}